

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase1407::run(TestCase1407 *this)

{
  Builder list;
  DebugExpression<bool> _kjCondition;
  StructReader local_240;
  MallocMessageBuilder builder2;
  Builder root;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestLists>
            (&root,&builder.super_MessageBuilder);
  capnproto_test::capnp::test::TestLists::Builder::initList1(&list,&root,8);
  ListBuilder::getStructElement((StructBuilder *)&builder2,&list.builder,0);
  *(byte *)builder2.super_MessageBuilder.arenaSpace[1] =
       *builder2.super_MessageBuilder.arenaSpace[1] | 1;
  ListBuilder::getStructElement((StructBuilder *)&builder2,&list.builder,1);
  *(byte *)builder2.super_MessageBuilder.arenaSpace[1] =
       *builder2.super_MessageBuilder.arenaSpace[1] | 1;
  ListBuilder::getStructElement((StructBuilder *)&builder2,&list.builder,2);
  *(byte *)builder2.super_MessageBuilder.arenaSpace[1] =
       *builder2.super_MessageBuilder.arenaSpace[1] & 0xfe;
  ListBuilder::getStructElement((StructBuilder *)&builder2,&list.builder,3);
  *(byte *)builder2.super_MessageBuilder.arenaSpace[1] =
       *builder2.super_MessageBuilder.arenaSpace[1] | 1;
  ListBuilder::getStructElement((StructBuilder *)&builder2,&list.builder,4);
  *(byte *)builder2.super_MessageBuilder.arenaSpace[1] =
       *builder2.super_MessageBuilder.arenaSpace[1] | 1;
  ListBuilder::getStructElement((StructBuilder *)&builder2,&list.builder,5);
  *(byte *)builder2.super_MessageBuilder.arenaSpace[1] =
       *builder2.super_MessageBuilder.arenaSpace[1] & 0xfe;
  ListBuilder::getStructElement((StructBuilder *)&builder2,&list.builder,6);
  *(byte *)builder2.super_MessageBuilder.arenaSpace[1] =
       *builder2.super_MessageBuilder.arenaSpace[1] | 1;
  ListBuilder::getStructElement((StructBuilder *)&builder2,&list.builder,7);
  *(byte *)builder2.super_MessageBuilder.arenaSpace[1] =
       *builder2.super_MessageBuilder.arenaSpace[1] & 0xfe;
  MallocMessageBuilder::MallocMessageBuilder(&builder2,0x400,GROW_HEURISTICALLY);
  ListBuilder::asReader(&list.builder);
  ListReader::getStructElement(&local_240,(ListReader *)&_kjCondition,2);
  MessageBuilder::setRoot<capnproto_test::capnp::test::TestLists::Struct1::Reader>
            (&builder2.super_MessageBuilder,(Reader *)&local_240);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestLists::Struct1>
            ((Builder *)&local_240,&builder2.super_MessageBuilder);
  _kjCondition.value = (bool)(*local_240.data & 1 ^ 1);
  if (((*local_240.data & 1) != 0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[72],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x590,ERROR,
               "\"failed: expected \" \"!(builder2.getRoot<test::TestLists::Struct1>().getF())\", _kjCondition"
               ,(char (*) [72])
                "failed: expected !(builder2.getRoot<test::TestLists::Struct1>().getF())",
               &_kjCondition);
  }
  ListBuilder::asReader(&list.builder);
  ListReader::getStructElement(&local_240,(ListReader *)&_kjCondition,6);
  MessageBuilder::setRoot<capnproto_test::capnp::test::TestLists::Struct1::Reader>
            (&builder2.super_MessageBuilder,(Reader *)&local_240);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestLists::Struct1>
            ((Builder *)&local_240,&builder2.super_MessageBuilder);
  _kjCondition.value = (bool)(*local_240.data & 1);
  if ((_kjCondition.value == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[69],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x592,ERROR,
               "\"failed: expected \" \"builder2.getRoot<test::TestLists::Struct1>().getF()\", _kjCondition"
               ,(char (*) [69])
                "failed: expected builder2.getRoot<test::TestLists::Struct1>().getF()",&_kjCondition
              );
  }
  MallocMessageBuilder::~MallocMessageBuilder(&builder2);
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Encoding, OneBitStructSetters) {
  // Test case of setting a 1-bit struct.

  MallocMessageBuilder builder;
  auto root = builder.getRoot<test::TestLists>();
  auto list = root.initList1(8);
  list[0].setF(true);
  list[1].setF(true);
  list[2].setF(false);
  list[3].setF(true);
  list[4].setF(true);
  list[5].setF(false);
  list[6].setF(true);
  list[7].setF(false);

  MallocMessageBuilder builder2;
  builder2.setRoot(list.asReader()[2]);
  EXPECT_FALSE(builder2.getRoot<test::TestLists::Struct1>().getF());
  builder2.setRoot(list.asReader()[6]);
  EXPECT_TRUE(builder2.getRoot<test::TestLists::Struct1>().getF());
}